

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

JavascriptFunction *
Js::TypedArrayBase::GetDefaultConstructor(Var object,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  JavascriptLibrary *pJVar5;
  ScriptContext *scriptContext_local;
  Var object_local;
  TypeId local_18;
  TypeId typeId;
  
  if (object == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(object);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(object);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(object);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  switch(local_18) {
  case TypeIds_Int8Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetInt8ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Uint8Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetUint8ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Uint8ClampedArray:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetUint8ClampedArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Int16Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetInt16ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Uint16Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetUint16ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Int32Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetInt32ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Uint32Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetUint32ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Float32Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetFloat32ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  case TypeIds_Float64Array:
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    object_local = JavascriptLibraryBase::GetFloat64ArrayConstructor
                             (&pJVar5->super_JavascriptLibraryBase);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9b5,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    object_local = (Var)0x0;
  }
  return (JavascriptFunction *)object_local;
}

Assistant:

JavascriptFunction* TypedArrayBase::GetDefaultConstructor(Var object, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(object))
        {
        case TypeId::TypeIds_Int8Array:
            return scriptContext->GetLibrary()->GetInt8ArrayConstructor();
        case TypeId::TypeIds_Uint8Array:
            return scriptContext->GetLibrary()->GetUint8ArrayConstructor();
        case TypeId::TypeIds_Uint8ClampedArray:
            return scriptContext->GetLibrary()->GetUint8ClampedArrayConstructor();
        case TypeId::TypeIds_Int16Array:
            return scriptContext->GetLibrary()->GetInt16ArrayConstructor();
        case TypeId::TypeIds_Uint16Array:
            return scriptContext->GetLibrary()->GetUint16ArrayConstructor();
        case TypeId::TypeIds_Int32Array:
            return scriptContext->GetLibrary()->GetInt32ArrayConstructor();
        case TypeId::TypeIds_Uint32Array:
            return scriptContext->GetLibrary()->GetUint32ArrayConstructor();
        case TypeId::TypeIds_Float32Array:
            return scriptContext->GetLibrary()->GetFloat32ArrayConstructor();
        case TypeId::TypeIds_Float64Array:
            return scriptContext->GetLibrary()->GetFloat64ArrayConstructor();
        default:
            Assert(UNREACHED);
            return nullptr;
        }
    }